

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

Aig_Man_t *
createMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,monotoneVectorsStruct *monotoneVectorArg,
          int *startMonotonePropPo)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vKnownMonotone;
  Vec_Int_t *vCandMonotone;
  Vec_Int_t *vHintMonotone;
  Aig_Obj_t *p1;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  Aig_Man_t *p;
  size_t sVar7;
  char *__s;
  Aig_Obj_t *pAVar8;
  uint *puVar9;
  void *pvVar10;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  Aig_Obj_t *p0;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  Aig_Obj_t *pAVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong local_80;
  Aig_Obj_t *local_60;
  long local_58;
  
  uVar24 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar23 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  vKnownMonotone = monotoneVectorArg->attrKnownMonotone;
  vCandMonotone = monotoneVectorArg->attrCandMonotone;
  vHintMonotone = monotoneVectorArg->attrHintMonotone;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar7 = strlen(pAig->pName);
  __s = (char *)malloc(sVar7 + 10);
  p->pName = __s;
  iVar22 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"_monotone");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar17 = 0;
    do {
      if (pAig->vCis->nSize <= lVar17) goto LAB_005b6efd;
      pvVar10 = pAig->vCis->pArray[lVar17];
      pAVar8 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar8;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar22 = 0;
    do {
      uVar5 = pAig->nTruePis + iVar22;
      if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_005b6efd;
      pvVar10 = pAig->vCis->pArray[uVar5];
      iVar22 = iVar22 + 1;
      pAVar8 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar8;
    } while (iVar22 < pAig->nRegs);
  }
  pAVar8 = Aig_ObjCreateCi(p);
  uVar5 = vHintMonotone->nSize;
  puVar9 = (uint *)malloc(0x10);
  uVar25 = 8;
  if (6 < uVar5 - 1) {
    uVar25 = (ulong)uVar5;
  }
  puVar9[1] = 0;
  uVar20 = (uint)uVar25;
  *puVar9 = uVar20;
  local_58 = 0;
  if (uVar20 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc((long)(int)uVar20 << 3);
  }
  *(void **)(puVar9 + 2) = pvVar10;
  if ((int)uVar5 < 1) {
    iVar18 = 1;
  }
  else {
    lVar17 = 0;
    do {
      pAVar11 = Aig_ObjCreateCi(p);
      iVar18 = (int)uVar25;
      if ((int)lVar17 == iVar18) {
        if (iVar18 < 0x10) {
          if (*(void **)(puVar9 + 2) == (void *)0x0) {
            pvVar10 = malloc(0x80);
          }
          else {
            pvVar10 = realloc(*(void **)(puVar9 + 2),0x80);
          }
          *(void **)(puVar9 + 2) = pvVar10;
          *puVar9 = 0x10;
          uVar25 = 0x10;
        }
        else {
          uVar25 = (ulong)(uint)(iVar18 * 2);
          if (*(void **)(puVar9 + 2) == (void *)0x0) {
            pvVar10 = malloc(uVar25 * 8);
          }
          else {
            pvVar10 = realloc(*(void **)(puVar9 + 2),uVar25 * 8);
          }
          *(void **)(puVar9 + 2) = pvVar10;
          *puVar9 = iVar18 * 2;
        }
      }
      else {
        pvVar10 = *(void **)(puVar9 + 2);
      }
      local_58 = lVar17 + 1;
      uVar5 = (uint)local_58;
      puVar9[1] = uVar5;
      *(Aig_Obj_t **)((long)pvVar10 + lVar17 * 8) = pAVar11;
      lVar17 = local_58;
    } while ((int)uVar5 < vHintMonotone->nSize);
    iVar18 = uVar5 + 1;
  }
  printf("\nnRegCount = %d\n");
  pVVar12 = pAig->vObjs;
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      pvVar10 = pVVar12->pArray[lVar17];
      if ((pvVar10 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar10 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar10 & 1) != 0) goto LAB_005b6f1c;
        uVar25 = *(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe;
        if (uVar25 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar10 + 8) & 1) ^ *(ulong *)(uVar25 + 0x28));
        }
        uVar25 = *(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe;
        if (uVar25 == 0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar10 + 0x10) & 1) ^ *(ulong *)(uVar25 + 0x28)
                    );
        }
        pAVar11 = Aig_And(p,pAVar11,pAVar16);
        *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar11;
        pVVar12 = pAig->vObjs;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar12->nSize);
  }
  if ((-1 < (int)uVar24) && ((int)uVar24 < pAig->vCos->nSize)) {
    uVar25 = *(ulong *)((long)pAig->vCos->pArray[uVar24] + 8);
    if ((uVar25 & 1) == 0) {
      pAVar11 = *(Aig_Obj_t **)(uVar25 + 0x28);
    }
    else {
      pAVar11 = (Aig_Obj_t *)(*(ulong *)((uVar25 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    local_60 = Aig_And(p,pAVar11,pAVar8);
    if (vKnownMonotone != (Vec_Int_t *)0x0) {
      iVar6 = pAig->nRegs;
      iVar2 = pAig->nObjs[3];
      pAVar8 = p->pConst1;
      checkSanityOfKnownMonotone(vKnownMonotone,vCandMonotone,vHintMonotone);
      if (0 < vKnownMonotone->nSize) {
        iVar23 = (uVar24 - iVar23) + 1;
        lVar17 = 0;
        do {
          iVar3 = vKnownMonotone->pArray[lVar17];
          printf("\nProcessing knownMonotone = %d\n",(ulong)(uint)(iVar3 + iVar23));
          uVar24 = iVar3 + iVar23;
          if (((int)uVar24 < 0) || (pAig->vCos->nSize <= (int)uVar24)) goto LAB_005b6efd;
          uVar25 = *(ulong *)((long)pAig->vCos->pArray[uVar24] + 8);
          if ((uVar25 & 1) == 0) {
            pAVar16 = *(Aig_Obj_t **)(uVar25 + 0x28);
          }
          else {
            pAVar16 = (Aig_Obj_t *)(*(ulong *)((uVar25 & 0xfffffffffffffffe) + 0x28) ^ 1);
          }
          uVar24 = uVar24 + (iVar6 - iVar2);
          if (((int)uVar24 < 0) || ((int)local_58 <= (int)uVar24)) goto LAB_005b6efd;
          p1 = *(Aig_Obj_t **)(*(long *)(puVar9 + 2) + (ulong)uVar24 * 8);
          p0 = Aig_And(p,pAVar16,p1);
          pAVar16 = Aig_And(p,(Aig_Obj_t *)((ulong)pAVar16 ^ 1),(Aig_Obj_t *)((ulong)p1 ^ 1));
          pAVar16 = Aig_Or(p,p0,pAVar16);
          pAVar8 = Aig_And(p,pAVar8,pAVar16);
          lVar17 = lVar17 + 1;
        } while (lVar17 < vKnownMonotone->nSize);
      }
      local_60 = Aig_And(p,local_60,pAVar8);
    }
    uVar24 = vHintMonotone->nSize;
    uVar21 = (ulong)uVar24;
    pvVar10 = malloc(0x10);
    uVar25 = 8;
    if (6 < uVar24 - 1) {
      uVar25 = (ulong)uVar24;
    }
    iVar23 = (int)uVar25;
    if (iVar23 == 0) {
      pvVar13 = (void *)0x0;
    }
    else {
      pvVar13 = malloc((long)iVar23 * 8);
    }
    *(void **)((long)pvVar10 + 8) = pvVar13;
    pvVar13 = malloc(0x10);
    if (iVar23 == 0) {
      pvVar14 = (void *)0x0;
    }
    else {
      pvVar14 = malloc((long)iVar23 << 3);
    }
    uVar19 = 0;
    *(void **)((long)pvVar13 + 8) = pvVar14;
    uVar5 = 0;
    if (0 < (int)uVar24) {
      uVar5 = 0;
      uVar19 = 0;
      uVar15 = uVar25;
      local_80 = uVar25;
      do {
        iVar23 = vHintMonotone->pArray[uVar19];
        if (((long)iVar23 < 0) || (pAig->vCos->nSize <= iVar23)) goto LAB_005b6efd;
        uVar4 = *(ulong *)((long)pAig->vCos->pArray[iVar23] + 8);
        if ((uVar4 & 1) == 0) {
          pAVar8 = *(Aig_Obj_t **)(uVar4 + 0x28);
        }
        else {
          pAVar8 = (Aig_Obj_t *)(*(ulong *)((uVar4 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        uVar24 = (uint)uVar19;
        if ((vKnownMonotone != (Vec_Int_t *)0x0) && (0 < (long)vKnownMonotone->nSize)) {
          lVar17 = 0;
          do {
            if (vKnownMonotone->pArray[lVar17] == iVar23) {
              uVar20 = (uint)uVar25;
              if (uVar24 == uVar20) {
                if ((int)uVar20 < 0x10) {
                  if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
                    pvVar14 = malloc(0x80);
                  }
                  else {
                    pvVar14 = realloc(*(void **)((long)pvVar10 + 8),0x80);
                  }
                  *(void **)((long)pvVar10 + 8) = pvVar14;
                  uVar25 = 0x10;
                  uVar15 = uVar25;
                }
                else {
                  uVar25 = (ulong)(uVar20 * 2);
                  if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
                    pvVar14 = malloc(uVar25 * 8);
                  }
                  else {
                    pvVar14 = realloc(*(void **)((long)pvVar10 + 8),uVar25 * 8);
                  }
                  *(void **)((long)pvVar10 + 8) = pvVar14;
                  uVar15 = uVar25;
                }
              }
              else {
                pvVar14 = *(void **)((long)pvVar10 + 8);
              }
              goto LAB_005b6c96;
            }
            lVar17 = lVar17 + 1;
          } while (vKnownMonotone->nSize != lVar17);
        }
        uVar25 = 0;
        while (vHintMonotone->pArray[uVar25] != iVar23) {
          uVar25 = uVar25 + 1;
          if ((uVar21 & 0xffffffff) == uVar25) goto LAB_005b6efd;
        }
        if ((int)local_58 <= (int)uVar25) goto LAB_005b6efd;
        pAVar16 = Aig_And(p,local_60,
                          *(Aig_Obj_t **)(*(long *)(puVar9 + 2) + (uVar25 & 0xffffffff) * 8));
        pAVar16 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar16 ^ 1),pAVar8);
        uVar20 = (uint)uVar15;
        if (uVar24 == uVar20) {
          if ((int)uVar20 < 0x10) {
            if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
              pvVar14 = malloc(0x80);
            }
            else {
              pvVar14 = realloc(*(void **)((long)pvVar10 + 8),0x80);
            }
            *(void **)((long)pvVar10 + 8) = pvVar14;
            uVar25 = 0x10;
          }
          else {
            uVar25 = (ulong)(uVar20 * 2);
            if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
              pvVar14 = malloc(uVar25 * 8);
            }
            else {
              pvVar14 = realloc(*(void **)((long)pvVar10 + 8),uVar25 * 8);
            }
            *(void **)((long)pvVar10 + 8) = pvVar14;
          }
        }
        else {
          pvVar14 = *(void **)((long)pvVar10 + 8);
          uVar25 = uVar15;
        }
        *(Aig_Obj_t **)((long)pvVar14 + (uVar19 & 0xffffffff) * 8) = pAVar8;
        uVar24 = (uint)local_80;
        if (uVar5 == uVar24) {
          if ((int)uVar24 < 0x10) {
            if (*(void **)((long)pvVar13 + 8) == (void *)0x0) {
              pvVar14 = malloc(0x80);
            }
            else {
              pvVar14 = realloc(*(void **)((long)pvVar13 + 8),0x80);
            }
            *(void **)((long)pvVar13 + 8) = pvVar14;
            local_80 = 0x10;
          }
          else {
            local_80 = (ulong)(uVar24 * 2);
            if (*(void **)((long)pvVar13 + 8) == (void *)0x0) {
              pvVar14 = malloc(local_80 * 8);
            }
            else {
              pvVar14 = realloc(*(void **)((long)pvVar13 + 8),local_80 * 8);
            }
            *(void **)((long)pvVar13 + 8) = pvVar14;
          }
        }
        else {
          pvVar14 = *(void **)((long)pvVar13 + 8);
        }
        pAVar8 = pAVar16;
        uVar15 = uVar25;
        uVar24 = uVar5;
        uVar5 = uVar5 + 1;
LAB_005b6c96:
        uVar19 = uVar19 + 1;
        *(Aig_Obj_t **)((long)pvVar14 + (long)(int)uVar24 * 8) = pAVar8;
        uVar21 = (ulong)vHintMonotone->nSize;
      } while ((long)uVar19 < (long)uVar21);
    }
    uVar25 = 0;
    if (0 < pAig->nTruePos) {
      uVar25 = 0;
      do {
        if ((long)pAig->vCos->nSize <= (long)uVar25) goto LAB_005b6efd;
        pvVar14 = pAig->vCos->pArray[uVar25];
        if (((ulong)pvVar14 & 1) != 0) goto LAB_005b6f1c;
        uVar21 = *(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffe;
        if (uVar21 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar14 + 8) & 1) ^ *(ulong *)(uVar21 + 0x28));
        }
        uVar25 = uVar25 + 1;
        pAVar8 = Aig_ObjCreateCo(p,pAVar8);
        *(Aig_Obj_t **)((long)pvVar14 + 0x28) = pAVar8;
      } while ((long)uVar25 < (long)pAig->nTruePos);
    }
    *startMonotonePropPo = (int)uVar25;
    uVar24 = 0;
    if (0 < (int)uVar5) {
      lVar17 = *(long *)((long)pvVar13 + 8);
      uVar21 = 0;
      do {
        lVar1 = uVar21 * 8;
        uVar21 = uVar21 + 1;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar17 + lVar1));
        uVar24 = uVar5;
      } while (uVar5 != uVar21);
    }
    if (pAig->nRegs < 1) {
      iVar23 = 0;
    }
    else {
      iVar23 = 0;
      do {
        uVar5 = pAig->nTruePos + iVar23;
        if (((int)uVar5 < 0) || (pAig->vCos->nSize <= (int)uVar5)) goto LAB_005b6efd;
        pvVar13 = pAig->vCos->pArray[uVar5];
        if (((ulong)pvVar13 & 1) != 0) {
LAB_005b6f1c:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar21 = *(ulong *)((long)pvVar13 + 8);
        uVar15 = uVar21 & 0xfffffffffffffffe;
        if (uVar15 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar21 & 1) ^ *(ulong *)(uVar15 + 0x28));
        }
        iVar23 = iVar23 + 1;
        Aig_ObjCreateCo(p,pAVar8);
      } while (iVar23 < pAig->nRegs);
    }
    Aig_ObjCreateCo(p,pAVar11);
    if ((int)uVar19 < 1) {
      uVar5 = 1;
    }
    else {
      lVar17 = *(long *)((long)pvVar10 + 8);
      uVar21 = 0;
      do {
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(lVar17 + uVar21 * 8));
        uVar21 = uVar21 + 1;
      } while ((uVar19 & 0xffffffff) != uVar21);
      uVar5 = (int)uVar19 + 1;
    }
    printf("\npoCopied = %d, poCreated = %d\n",uVar25 & 0xffffffff,uVar24);
    printf("\nliCreated++ = %d\n",(ulong)uVar5);
    Aig_ManSetRegNum(p,iVar18 + iVar22);
    Aig_ManCleanup(p);
    iVar6 = Aig_ManCheck(p);
    if (iVar6 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                    ,0x154,
                    "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                   );
    }
    if (iVar18 + iVar22 != uVar5 + iVar23) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                    ,0x155,
                    "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                   );
    }
    printf("\nSaig_ManPoNum = %d\n",(ulong)(uint)p->nTruePos);
    return p;
  }
LAB_005b6efd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t *createMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount, oldPoNum, poSerialNum, iElemHint;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pHintSignalLo, *pHintMonotoneFlop, *pObjTemp1, *pObjTemp2, *pObjKnownMonotoneAnd;
	Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vHintMonotoneLocalFlopOutput;
	Vec_Ptr_t *vHintMonotoneLocalProp;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;
	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "_monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vHintMonotoneLocalFlopOutput = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		loCreated++;
		pHintMonotoneFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vHintMonotoneLocalFlopOutput, pHintMonotoneFlop );
	}

	nRegCount = loCreated + loCopied;
	printf("\nnRegCount = %d\n", nRegCount);

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
	pObjKnownMonotoneAnd = Aig_ManConst1( pNewAig );
	#if 1
	if( vKnownMonotoneLocal )
	{
		assert( checkSanityOfKnownMonotone( vKnownMonotoneLocal, vCandMonotoneLocal, vHintMonotoneLocal ) );

		Vec_IntForEachEntry( vKnownMonotoneLocal, iElemHint, i )
		{
			iElem = (iElemHint - hintSingalBeginningMarkerLocal) + 1 + pendingSignalIndexLocal;
			printf("\nProcessing knownMonotone = %d\n", iElem);
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, iElem - oldPoNum);
			pObjTemp1 = Aig_Or( pNewAig, Aig_And(pNewAig, pObjDriverNew, pHintSignalLo), 
						Aig_And(pNewAig, Aig_Not(pObjDriverNew), Aig_Not(pHintSignalLo)) );
			
			pObjKnownMonotoneAnd = Aig_And( pNewAig, pObjKnownMonotoneAnd, pObjTemp1 );
		}
		pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingAndNextPending, pObjKnownMonotoneAnd );
	}
	#endif

	vHintMonotoneLocalDriverNew = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	vHintMonotoneLocalProp = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

		if( vKnownMonotoneLocal != NULL && Vec_IntFind( vKnownMonotoneLocal, iElem ) != -1 )
		{
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
		}
		else
		{
			poSerialNum = Vec_IntFind( vHintMonotoneLocal, iElem );
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, poSerialNum );
			pObjTemp1 = Aig_And( pNewAig, pObjPendingAndNextPending, pHintSignalLo);
			pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), pObjDriverNew );
			//pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), Aig_ManConst1( pNewAig ));
			//pObjTemp2 = Aig_ManConst1( pNewAig );
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
			Vec_PtrPush(vHintMonotoneLocalProp, pObjTemp2); 
		}
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalDriverNew, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	printf("\npoCopied = %d, poCreated = %d\n", poCopied, poCreated);
	printf("\nliCreated++ = %d\n", liCreated );
	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	printf("\nSaig_ManPoNum = %d\n", Saig_ManPoNum(pNewAig));
	return pNewAig;
}